

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMetaDataSetString(FmsMetaData mdata,char *mdata_name,char *c_string)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = FmsMetaDataClear(mdata);
    if (iVar1 == 0) {
      if (c_string == (char *)0x0) {
        bVar4 = true;
        __s = (char *)0x0;
      }
      else {
        __s = strdup(c_string);
        bVar4 = __s != (char *)0x0;
      }
      iVar1 = 2;
      if (bVar4) {
        if (mdata_name == (char *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = strdup(mdata_name);
          if (pcVar2 == (char *)0x0) {
            free(__s);
            return 2;
          }
        }
        mdata->name = pcVar2;
        mdata->md_type = FMS_STRING;
        iVar1 = 0;
        if (__s == (char *)0x0) {
          sVar3 = 0;
        }
        else {
          sVar3 = strlen(__s);
        }
        mdata->num_entries = sVar3;
        mdata->data = __s;
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetString(FmsMetaData mdata, const char *mdata_name,
                         const char *c_string) {
  if (!mdata) { E_RETURN(1); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  char *md_data;
  if (FmsCopyString(c_string, &md_data)) { E_RETURN(2); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(2); }
  mdata->md_type = FMS_STRING;
  mdata->num_entries = md_data ? strlen(md_data) : 0;
  mdata->data = md_data;
  return 0;
}